

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

DnssecPrefixEntry * __thiscall
BinHash<DnssecPrefixEntry>::DoInsert
          (BinHash<DnssecPrefixEntry> *this,DnssecPrefixEntry *key,bool need_alloc,bool *stored)

{
  DnssecPrefixEntry **ppDVar1;
  ulong uVar2;
  bool bVar3;
  uint32_t uVar4;
  DnssecPrefixEntry *key_00;
  
  *stored = false;
  key_00 = (DnssecPrefixEntry *)0x0;
  if ((key != (DnssecPrefixEntry *)0x0) && (this->tableSize != 0)) {
    uVar4 = DnssecPrefixEntry::Hash(key);
    uVar2 = (ulong)uVar4 % (ulong)this->tableSize;
    key_00 = (DnssecPrefixEntry *)(this->hashBin + uVar2);
    do {
      key_00 = key_00->HashNext;
      if (key_00 == (DnssecPrefixEntry *)0x0) {
        if (need_alloc) {
          key = DnssecPrefixEntry::CreateCopy(key);
        }
        ppDVar1 = this->hashBin;
        key->HashNext = ppDVar1[uVar2];
        ppDVar1[uVar2] = key;
        *stored = true;
        this->tableCount = this->tableCount + 1;
        return key;
      }
      bVar3 = DnssecPrefixEntry::IsSameKey(key,key_00);
    } while (!bVar3);
    key_00->is_dnssec = (bool)(key_00->is_dnssec | key->is_dnssec);
    *stored = false;
  }
  return key_00;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }